

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

bool isReachable(BasicBlock *basicBlock)

{
  int iVar1;
  BasicBlock *pBVar2;
  bool bVar3;
  
  iVar1 = predecessorsNumber(basicBlock);
  bVar3 = true;
  if (iVar1 < 1) {
    pBVar2 = (BasicBlock *)(*(long *)(*(long *)(basicBlock + 0x38) + 0x50) + -0x18);
    if (*(long *)(*(long *)(basicBlock + 0x38) + 0x50) == 0) {
      pBVar2 = (BasicBlock *)0x0;
    }
    bVar3 = pBVar2 == basicBlock;
  }
  return bVar3;
}

Assistant:

bool isReachable(const BasicBlock *basicBlock) {
    return predecessorsNumber(basicBlock) > 0 ||
           &basicBlock->getParent()->front() == basicBlock;
}